

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalExpression *expr)

{
  bool bVar1;
  size_t sVar2;
  Expression *pEVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  bool prevInCondition;
  int iVar9;
  bool prevInCondition_1;
  pointer pCVar10;
  int iVar11;
  ConstantValue knownVal;
  ConstantValue cv;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_e8;
  uint local_e0;
  undefined2 local_dc;
  undefined1 local_d1;
  ConditionalExpression *local_d0;
  pointer local_c8;
  int *local_c0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *local_b8;
  int *local_b0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  undefined1 local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  SVInt::SVInt((SVInt *)&local_a8,(SVIntStorage *)SVInt::One);
  local_a8._M_index = '\x01';
  sVar2 = (expr->conditions)._M_extent._M_extent_value;
  if (sVar2 == 0) {
    iVar9 = 0;
    piVar7 = &this->state;
  }
  else {
    pCVar10 = (expr->conditions)._M_ptr;
    local_c8 = pCVar10 + sVar2;
    local_b0 = &this->stateWhenTrue;
    local_c0 = &this->state;
    iVar9 = 0;
    local_d0 = expr;
    do {
      pEVar3 = (pCVar10->expr).ptr;
      bVar5 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar5;
      adjustConditionalState((ConstantValue *)&local_58,this,pEVar3);
      if ((local_58._M_index == '\0') || (local_a8._M_index == '\0')) {
        local_60 = 0;
        local_e8.pVal = (uint64_t *)&local_a8;
        std::operator=(&local_e8,&local_80,&local_b8);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
      }
      else {
        bVar5 = ConstantValue::isTrue((ConstantValue *)&local_a8);
        if (bVar5) {
          bVar5 = ConstantValue::isTrue((ConstantValue *)&local_58);
        }
        else {
          bVar5 = false;
        }
        local_e8.val._1_7_ = 0;
        local_e8.val._0_1_ = bVar5;
        local_dc = 1;
        if (bVar5 == false) {
          local_e0 = 0x40;
        }
        else {
          lVar4 = 0x3f;
          if ((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)local_e8.val !=
              (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)0x0) {
            for (; bVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          local_e0 = (uint)lVar4 ^ 0x3f;
        }
        local_e0 = 0x41 - local_e0;
        SVInt::clearUnusedBits((SVInt *)&local_e8);
        local_80._0_8_ = local_e8;
        local_80._8_4_ = local_e0;
        local_80._12_1_ = (undefined1)local_dc;
        local_80._13_1_ = local_dc._1_1_;
        if (0x40 < local_e0 || (local_dc & 0x100) != 0) {
          local_e8.val = 0;
        }
        local_60 = 1;
        local_b8 = &local_a8;
        std::operator=(&local_b8,&local_80,&local_d1);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
        if (((0x40 < local_e0) || ((local_dc & 0x100) != 0)) &&
           ((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             *)local_e8.val !=
            (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             *)0x0)) {
          operator_delete__(local_e8.pVal);
        }
      }
      if (pCVar10->pattern != (Pattern *)0x0) {
        ast::Pattern::visit<TestAnalysis>(pCVar10->pattern,(TestAnalysis *)this);
      }
      iVar9 = iVar9 + this->stateWhenFalse;
      this->isStateSplit = false;
      this->state = this->stateWhenTrue;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != local_c8);
    piVar7 = local_c0;
    expr = local_d0;
    if (local_a8._M_index == '\0') {
      pEVar3 = local_d0->left_;
      *(bool *)(local_b0 + 2) = false;
      local_b0[0] = 0;
      local_b0[1] = 0;
      bVar5 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      bVar1 = this->isStateSplit;
      iVar8 = this->state;
      iVar6 = iVar8;
      iVar11 = iVar8;
      if (bVar1 != false) {
        iVar6 = this->stateWhenTrue;
        iVar11 = this->stateWhenFalse;
      }
      local_c8 = (pointer)CONCAT44(local_c8._4_4_,iVar6);
      pEVar3 = local_d0->right_;
      this->isStateSplit = false;
      this->state = iVar9;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar5;
      if (bVar1 == false) {
        if ((this->isStateSplit & 1U) == 0) {
          *local_c0 = *local_c0 + iVar8;
          goto LAB_001ecf90;
        }
LAB_001ecf67:
        iVar8 = this->stateWhenTrue;
        iVar9 = this->stateWhenFalse;
      }
      else {
        if ((this->isStateSplit & 1U) != 0) goto LAB_001ecf67;
        iVar9 = this->state;
        this->isStateSplit = true;
        this->state = 0;
        this->stateWhenTrue = iVar9;
        this->stateWhenFalse = iVar9;
        iVar8 = iVar9;
      }
      this->stateWhenTrue = iVar8 + (int)local_c8;
      this->stateWhenFalse = iVar9 + iVar11;
      goto LAB_001ecf90;
    }
  }
  iVar8 = *piVar7;
  bVar5 = ConstantValue::isTrue((ConstantValue *)&local_a8);
  if (bVar5) {
    pEVar3 = expr->right_;
    this->isStateSplit = false;
    this->state = iVar9;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    bVar5 = this->inCondition;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    pEVar3 = expr->left_;
    this->isStateSplit = false;
    this->inCondition = true;
    this->state = iVar8;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    this->inCondition = bVar5;
  }
  else {
    pEVar3 = expr->left_;
    this->isStateSplit = false;
    this->state = iVar8;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    bVar5 = this->inCondition;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    pEVar3 = expr->right_;
    this->isStateSplit = false;
    this->inCondition = true;
    this->state = iVar9;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    this->inCondition = bVar5;
  }
LAB_001ecf90:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_a8);
  return;
}

Assistant:

void visitExpr(const ConditionalExpression& expr) {
        // TODO: handle the special ambiguous 'x merging of both sides
        ConstantValue knownVal = SVInt::One;
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : expr.conditions) {
            auto cv = visitCondition(*cond.expr);
            if (cv && knownVal)
                knownVal = SVInt(knownVal.isTrue() && cv.isTrue() ? 1 : 0);
            else
                knownVal = nullptr;

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        auto visitSide = [this](const Expression& expr, TState&& newState) {
            setState(std::move(newState));
            visitNoJoin(expr);
        };

        auto trueState = std::move(state);
        if (knownVal) {
            // Special case: if the condition is constant, we will visit
            // the opposing side first and then essentially throw that
            // state away instead of joining it.
            if (knownVal.isTrue()) {
                visitSide(expr.right(), std::move(falseState));
                visitSide(expr.left(), std::move(trueState));
            }
            else {
                visitSide(expr.left(), std::move(trueState));
                visitSide(expr.right(), std::move(falseState));
            }
        }
        else {
            // Otherwise visit both sides and join as needed.
            visitSide(expr.left(), std::move(trueState));

            bool conditionalAfterLeft = isStateSplit;
            TState trueAfterLeft, falseAfterLeft;
            if (conditionalAfterLeft) {
                trueAfterLeft = std::move(stateWhenTrue);
                falseAfterLeft = std::move(stateWhenFalse);
            }
            else {
                trueAfterLeft = (DERIVED).copyState(state);
                falseAfterLeft = std::move(state);
            }

            visitSide(expr.right(), std::move(falseState));
            if (!conditionalAfterLeft && !isStateSplit) {
                (DERIVED).joinState(state, trueAfterLeft);
            }
            else {
                split();
                (DERIVED).joinState(stateWhenTrue, trueAfterLeft);
                (DERIVED).joinState(stateWhenFalse, falseAfterLeft);
            }
        }
    }